

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NewFrame(void)

{
  ImVector<ImGuiContextHook> *this;
  ImVector<ImGuiViewportP_*> *pIVar1;
  ImVector<ImGuiWindow_*> *this_00;
  ImGuiNextWindowData *pIVar2;
  ImVector<ImGuiStackLevelInfo> *pIVar3;
  ImVector<float> *this_01;
  ImVector<ImGuiTableTempData> *this_02;
  ImVec2 *pIVar4;
  ImGuiNavLayer IVar5;
  ImFontAtlas *pIVar6;
  char *pcVar7;
  _func_bool_ImGuiViewport_ptr *p_Var8;
  _func_float_ImGuiViewport_ptr *p_Var9;
  _func_void_ImGuiViewport_ptr *p_Var10;
  ImVec2 IVar11;
  undefined1 auVar12 [16];
  ushort uVar13;
  ImGuiNavDirSourceFlags dir_sources;
  long lVar14;
  ImGuiViewportP *pIVar15;
  ImGuiContext *pIVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined4 extraout_EAX;
  ImGuiID IVar22;
  ImGuiKeyModFlags IVar23;
  ImGuiInputSource IVar24;
  ImGuiNavLayer layer;
  ImGuiContext *g;
  ImGuiContextHook *pIVar25;
  ImGuiViewportP **ppIVar26;
  ImGuiPlatformMonitor *pIVar27;
  ImVec2 *pIVar28;
  ImGuiWindow **ppIVar29;
  ImFont *font;
  ImGuiWindow *pIVar30;
  float *pfVar31;
  ImGuiTable *table;
  ImGuiTableTempData *pIVar32;
  ImGuiStackLevelInfo *pIVar33;
  ImGuiPopupData *pIVar34;
  ImRect *pIVar35;
  int i;
  uint uVar36;
  ImGuiID IVar37;
  ImGuiWindow *window_00;
  ImGuiWindow *parent;
  long lVar38;
  ImGuiWindow *pIVar39;
  int window_n;
  ImGuiViewportP *pIVar40;
  int n;
  int iVar41;
  bool *pbVar42;
  float *pfVar43;
  float *pfVar44;
  int n_1;
  ImGuiWindow *window;
  ImVector<ImGuiPlatformMonitor> *pIVar45;
  ImGuiContext *pIVar46;
  ImVector<ImGuiViewportP_*> *this_03;
  ImGuiViewportP *pIVar47;
  ImGuiContext *pIVar48;
  byte bVar49;
  int iVar50;
  uint uVar51;
  uint uVar52;
  int iVar53;
  float fVar54;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined1 auVar61 [12];
  float fVar55;
  ImVec2 IVar57;
  ImVec2 IVar56;
  ImVec2 IVar58;
  ImVec2 IVar60;
  undefined1 auVar63 [16];
  undefined1 extraout_var [12];
  undefined4 uVar68;
  undefined1 auVar64 [16];
  double dVar59;
  undefined1 auVar65 [16];
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar76;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  ImRect IVar77;
  float local_b8;
  float fStack_b4;
  float local_a8;
  float fStack_a4;
  ImGuiViewportP *local_98;
  ImRect local_78;
  ImGuiContext *local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImGuiIO *local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 auVar62 [16];
  
  pIVar48 = GImGui;
  bVar49 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1003,"void ImGui::NewFrame()");
  }
  this = &GImGui->Hooks;
  iVar41 = (GImGui->Hooks).Size;
  while (0 < iVar41) {
    iVar41 = iVar41 + -1;
    pIVar25 = ImVector<ImGuiContextHook>::operator[](this,iVar41);
    if (*(int *)(pIVar25 + 4) == 7) {
      pIVar25 = ImVector<ImGuiContextHook>::operator[](this,iVar41);
      ImVector<ImGuiContextHook>::erase(this,pIVar25);
    }
  }
  CallContextHooks(pIVar48,ImGuiContextHookType_NewFramePre);
  pIVar48->ConfigFlagsLastFrame = pIVar48->ConfigFlagsCurrFrame;
  pIVar46 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb0,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  iVar41 = GImGui->FrameCount;
  if ((GImGui->IO).DeltaTime <= 0.0) {
    if (iVar41 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1eb1,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
LAB_0012a777:
    iVar41 = 0;
    bVar17 = true;
  }
  else {
    if (iVar41 == 0) goto LAB_0012a777;
    if (GImGui->FrameCountEnded != iVar41) {
      __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1eb2,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    bVar17 = false;
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar6 = (GImGui->IO).Fonts;
  if (((pIVar6->Fonts).Size < 1) || ((pIVar6->TexReady & 1U) == 0)) {
    __assert_fail("g.IO.Fonts->IsBuilt() && \"Font Atlas not built! Make sure you called ImGui_ImplXXXX_NewFrame() function for renderer backend, which should call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb4,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb5,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CircleTessellationMaxError <= 0.0) {
    __assert_fail("g.Style.CircleTessellationMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb6,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar54 = (GImGui->Style).Alpha;
  if ((fVar54 < 0.0) || (1.0 < fVar54)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb7,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb8,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1eb9,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar38 = 0xf;
  while (lVar38 != 0x25) {
    lVar14 = lVar38 + -0xf;
    lVar38 = lVar38 + 1;
    if (0x200 < (GImGui->IO).KeyMap[lVar14] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown)))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ebb,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  uVar36 = (GImGui->IO).ConfigFlags;
  if (((uVar36 & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1ebf,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (iVar41 == 1) {
    if (((uVar36 & 0x40) != 0) && ((pIVar46->ConfigFlagsLastFrame & 0x40) == 0)) {
      __assert_fail("0 && \"Please set DockingEnable before the first call to NewFrame()! Otherwise you will lose your .ini settings!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1ec7,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((uVar36 >> 10 & 1) != 0) {
      if ((pIVar46->ConfigFlagsLastFrame & 0x400) == 0) {
        __assert_fail("0 && \"Please set ViewportsEnable before the first call to NewFrame()! Otherwise you will lose your .ini settings!\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x1ec9,"void ImGui::ErrorCheckNewFrameSanityChecks()");
      }
LAB_0012a8fa:
      if ((~(pIVar46->IO).BackendFlags & 0x1400U) == 0) {
        if ((!bVar17) && (iVar41 != pIVar46->FrameCountPlatformEnded)) {
          __assert_fail("(g.FrameCount == 0 || g.FrameCount == g.FrameCountPlatformEnded) && \"Forgot to call UpdatePlatformWindows() in main loop after EndFrame()? Check examples/ applications for reference.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x1ed0,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        if ((pIVar46->PlatformIO).Platform_CreateWindow == (_func_void_ImGuiViewport_ptr *)0x0) {
          __assert_fail("g.PlatformIO.Platform_CreateWindow != __null && \"Platform init didn\'t install handlers?\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x1ed1,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        if ((pIVar46->PlatformIO).Platform_DestroyWindow == (_func_void_ImGuiViewport_ptr *)0x0) {
          __assert_fail("g.PlatformIO.Platform_DestroyWindow != __null && \"Platform init didn\'t install handlers?\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x1ed2,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        if ((pIVar46->PlatformIO).Platform_GetWindowPos == (_func_ImVec2_ImGuiViewport_ptr *)0x0) {
          __assert_fail("g.PlatformIO.Platform_GetWindowPos != __null && \"Platform init didn\'t install handlers?\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x1ed3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        if ((pIVar46->PlatformIO).Platform_SetWindowPos ==
            (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0) {
          __assert_fail("g.PlatformIO.Platform_SetWindowPos != __null && \"Platform init didn\'t install handlers?\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x1ed4,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        if ((pIVar46->PlatformIO).Platform_GetWindowSize == (_func_ImVec2_ImGuiViewport_ptr *)0x0) {
          __assert_fail("g.PlatformIO.Platform_GetWindowSize != __null && \"Platform init didn\'t install handlers?\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x1ed5,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        if ((pIVar46->PlatformIO).Platform_SetWindowSize ==
            (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0) {
          __assert_fail("g.PlatformIO.Platform_SetWindowSize != __null && \"Platform init didn\'t install handlers?\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x1ed6,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        if ((pIVar46->PlatformIO).Monitors.Size < 1) {
          __assert_fail("g.PlatformIO.Monitors.Size > 0 && \"Platform init didn\'t setup Monitors list?\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x1ed7,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        ppIVar26 = ImVector<ImGuiViewportP_*>::operator[](&pIVar46->Viewports,0);
        if ((((*ppIVar26)->super_ImGuiViewport).PlatformUserData == (void *)0x0) &&
           (ppIVar26 = ImVector<ImGuiViewportP_*>::operator[](&pIVar46->Viewports,0),
           ((*ppIVar26)->super_ImGuiViewport).PlatformHandle == (void *)0x0)) {
          __assert_fail("(g.Viewports[0]->PlatformUserData != __null || g.Viewports[0]->PlatformHandle != __null) && \"Platform init didn\'t setup main viewport.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x1ed8,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        if ((((pIVar46->IO).ConfigDockingTransparentPayload != false) &&
            (((pIVar46->IO).ConfigFlags & 0x40) != 0)) &&
           ((pIVar46->PlatformIO).Platform_SetWindowAlpha ==
            (_func_void_ImGuiViewport_ptr_float *)0x0)) {
          __assert_fail("g.PlatformIO.Platform_SetWindowAlpha != __null && \"Platform_SetWindowAlpha handler is required to use io.ConfigDockingTransparent!\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x1eda,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
      }
      else {
        (pIVar46->IO).ConfigFlags = uVar36 & 0xfffffbff;
      }
      pIVar45 = &(pIVar46->PlatformIO).Monitors;
      iVar41 = 0;
      while (pIVar46 = GImGui, iVar41 < pIVar45->Size) {
        pIVar27 = ImVector<ImGuiPlatformMonitor>::operator[](pIVar45,iVar41);
        fVar54 = (pIVar27->MainSize).x;
        if ((fVar54 <= 0.0) || (fVar55 = (pIVar27->MainSize).y, fVar55 <= 0.0)) {
          __assert_fail("mon.MainSize.x > 0.0f && mon.MainSize.y > 0.0f && \"Monitor main bounds not setup properly.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x1ee7,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        fVar69 = (pIVar27->WorkPos).x;
        fVar70 = (pIVar27->WorkPos).y;
        fVar71 = (pIVar27->MainPos).x;
        if (fVar69 < fVar71) {
LAB_0012d8fb:
          __assert_fail("ImRect(mon.MainPos, mon.MainPos + mon.MainSize).Contains(ImRect(mon.WorkPos, mon.WorkPos + mon.WorkSize)) && \"Monitor work bounds not setup properly. If you don\'t have work area information, just copy MainPos/MainSize into them.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x1ee8,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        fVar76 = (pIVar27->MainPos).y;
        uVar13 = -(ushort)(fVar76 <= fVar70);
        if ((uVar13 & 1) == 0) goto LAB_0012d8fb;
        iVar50 = -(uint)(fVar69 + (pIVar27->WorkSize).x <= fVar54 + fVar71);
        iVar53 = -(uint)(fVar70 + (pIVar27->WorkSize).y <= fVar55 + fVar76);
        auVar73._4_4_ = iVar50;
        auVar73._0_4_ = iVar50;
        auVar73._8_4_ = iVar53;
        auVar73._12_4_ = iVar53;
        uVar36 = movmskpd((uint)uVar13,auVar73);
        if (((uVar36 & 1) == 0) || ((byte)((byte)uVar36 >> 1) == 0)) goto LAB_0012d8fb;
        iVar41 = iVar41 + 1;
        if ((pIVar27->DpiScale == 0.0) && (!NAN(pIVar27->DpiScale))) {
          __assert_fail("mon.DpiScale != 0.0f",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x1ee9,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
      }
    }
  }
  else if ((uVar36 >> 10 & 1) != 0) goto LAB_0012a8fa;
  pIVar48->ConfigFlagsCurrFrame = (pIVar48->IO).ConfigFlags;
  if (pIVar46->SettingsLoaded == false) {
    if ((pIVar46->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x2c47,"void ImGui::UpdateSettings()");
    }
    pcVar7 = (pIVar46->IO).IniFilename;
    if (pcVar7 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar7);
    }
    pIVar46->SettingsLoaded = true;
  }
  if ((0.0 < pIVar46->SettingsDirtyTimer) &&
     (fVar54 = pIVar46->SettingsDirtyTimer - (pIVar46->IO).DeltaTime,
     pIVar46->SettingsDirtyTimer = fVar54, fVar54 <= 0.0)) {
    pcVar7 = (pIVar46->IO).IniFilename;
    if (pcVar7 == (char *)0x0) {
      (pIVar46->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar7);
    }
    pIVar46->SettingsDirtyTimer = 0.0;
  }
  pIVar48->Time = (double)(pIVar48->IO).DeltaTime + pIVar48->Time;
  pIVar48->WithinFrameScope = true;
  pIVar48->FrameCount = pIVar48->FrameCount + 1;
  pIVar48->TooltipOverrideCount = 0;
  pIVar48->WindowsActiveCount = 0;
  ImVector<unsigned_int>::resize(&pIVar48->MenusIdSubmittedThisFrame,0);
  fVar54 = (pIVar48->IO).DeltaTime;
  iVar41 = pIVar48->FramerateSecPerFrameIdx;
  pIVar48->FramerateSecPerFrameAccum =
       (fVar54 - pIVar48->FramerateSecPerFrame[iVar41]) + pIVar48->FramerateSecPerFrameAccum;
  pIVar48->FramerateSecPerFrame[iVar41] = fVar54;
  pIVar48->FramerateSecPerFrameIdx = (iVar41 + 1) % 0x78;
  iVar41 = 0x77;
  if (pIVar48->FramerateSecPerFrameCount < 0x77) {
    iVar41 = pIVar48->FramerateSecPerFrameCount;
  }
  pIVar48->FramerateSecPerFrameCount = iVar41 + 1;
  uVar36 = -(uint)(0.0 < pIVar48->FramerateSecPerFrameAccum);
  (pIVar48->IO).Framerate =
       (float)(~uVar36 & 0x7f7fffff |
              (uint)(1.0 / (pIVar48->FramerateSecPerFrameAccum / (float)(iVar41 + 1))) & uVar36);
  pIVar46 = GImGui;
  iVar41 = (GImGui->Viewports).Size;
  if (iVar41 < (GImGui->PlatformIO).Viewports.Size) {
    __assert_fail("g.PlatformIO.Viewports.Size <= g.Viewports.Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x2e46,"void ImGui::UpdateViewportsNewFrame()");
  }
  pIVar1 = &GImGui->Viewports;
  uVar36 = GImGui->ConfigFlagsCurrFrame;
  if ((uVar36 >> 10 & 1) != 0) {
    for (iVar50 = 0; iVar50 < iVar41; iVar50 = iVar50 + 1) {
      ppIVar26 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,iVar50);
      p_Var8 = (pIVar46->PlatformIO).Platform_GetWindowMinimized;
      if ((p_Var8 != (_func_bool_ImGuiViewport_ptr *)0x0) &&
         (pIVar40 = *ppIVar26, pIVar40->PlatformWindowCreated == true)) {
        bVar17 = (*p_Var8)(&pIVar40->super_ImGuiViewport);
        (pIVar40->super_ImGuiViewport).Flags =
             (uint)bVar17 << 10 | (pIVar40->super_ImGuiViewport).Flags & 0xfffffbffU;
      }
      iVar41 = pIVar1->Size;
    }
  }
  ppIVar26 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,0);
  local_98 = *ppIVar26;
  if ((local_98->super_ImGuiViewport).ID != 0x11111111) {
    __assert_fail("main_viewport->ID == IMGUI_VIEWPORT_DEFAULT_ID",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x2e5e,"void ImGui::UpdateViewportsNewFrame()");
  }
  if (local_98->Window != (ImGuiWindow *)0x0) {
    __assert_fail("main_viewport->Window == __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x2e5f,"void ImGui::UpdateViewportsNewFrame()");
  }
  if ((uVar36 >> 10 & 1) == 0) {
    local_58.x = 0.0;
    local_58.y = 0.0;
    local_60 = (pIVar46->IO).DisplaySize;
  }
  else {
    local_58 = (*(pIVar46->PlatformIO).Platform_GetWindowPos)(&local_98->super_ImGuiViewport);
    local_60 = (pIVar46->IO).DisplaySize;
    if (((local_98->super_ImGuiViewport).Flags & 0x400) != 0) {
      local_58 = (local_98->super_ImGuiViewport).Pos;
      local_60 = (local_98->super_ImGuiViewport).Size;
    }
  }
  local_68 = pIVar48;
  local_50 = &pIVar48->IO;
  iVar41 = 0;
  AddUpdateViewport((ImGuiWindow *)0x0,0x11111111,&local_58,&local_60,0x1004);
  pIVar46->CurrentDpiScale = 0.0;
  pIVar45 = &(pIVar46->PlatformIO).Monitors;
  pIVar46->CurrentViewport = (ImGuiViewportP *)0x0;
  pIVar46->MouseViewport = (ImGuiViewportP *)0x0;
  while (pIVar48 = local_68, iVar41 < pIVar1->Size) {
    pIVar28 = (ImVec2 *)ImVector<ImGuiViewportP_*>::operator[](pIVar1,iVar41);
    IVar57 = *pIVar28;
    *(int *)((long)IVar57 + 0x5c) = iVar41;
    pIVar48 = GImGui;
    if ((iVar41 == 0) || (pIVar46->FrameCount + -2 <= *(int *)((long)IVar57 + 0x60))) {
      bVar17 = *(bool *)((long)IVar57 + 0x7e);
      if (((uVar36 >> 10 & 1) != 0) && (((*(byte *)((long)IVar57 + 5) & 4) == 0 & bVar17) == 1)) {
        if (*(bool *)((long)IVar57 + 0x58) == true) {
          IVar56 = (*(pIVar46->PlatformIO).Platform_GetWindowPos)((ImGuiViewport *)IVar57);
          *(ImVec2 *)((long)IVar57 + 0xf8) = IVar56;
          *(ImVec2 *)((long)IVar57 + 8) = IVar56;
        }
        if (*(bool *)((long)IVar57 + 0x59) == true) {
          IVar56 = (*(pIVar46->PlatformIO).Platform_GetWindowSize)((ImGuiViewport *)IVar57);
          *(ImVec2 *)((long)IVar57 + 0x100) = IVar56;
          *(ImVec2 *)((long)IVar57 + 0x10) = IVar56;
        }
      }
      UpdateViewportPlatformMonitor((ImGuiViewportP *)IVar57);
      *(ImVec2 *)((long)IVar57 + 0x110) = *(ImVec2 *)((long)IVar57 + 0x120);
      *(ImVec2 *)((long)IVar57 + 0x118) = *(ImVec2 *)((long)IVar57 + 0x128);
      ((ImVec2 *)((long)IVar57 + 0x120))->x = 0.0;
      ((ImVec2 *)((long)IVar57 + 0x120))->y = 0.0;
      ((ImVec2 *)((long)IVar57 + 0x128))->x = 0.0;
      ((ImVec2 *)((long)IVar57 + 0x128))->y = 0.0;
      ImGuiViewportP::UpdateWorkRect((ImGuiViewportP *)IVar57);
      *(float *)((long)IVar57 + 0x74) = 1.0;
      if ((*(byte *)((long)IVar57 + 5) & 0x10) != 0) {
        IVar56 = *(ImVec2 *)((long)IVar57 + 8);
        IVar58 = *(ImVec2 *)((long)IVar57 + 0x6c);
        iVar50 = -(uint)(IVar56.x - IVar58.x != 0.0);
        iVar53 = -(uint)(IVar56.y - IVar58.y != 0.0);
        auVar63._4_4_ = iVar53;
        auVar63._0_4_ = iVar50;
        auVar63._8_4_ = iVar53;
        auVar63._12_4_ = iVar53;
        auVar62._8_8_ = auVar63._8_8_;
        auVar62._4_4_ = iVar50;
        auVar62._0_4_ = iVar50;
        iVar50 = movmskpd(extraout_EAX,auVar62);
        if (iVar50 != 0) {
          TranslateWindowsInViewport
                    ((ImGuiViewportP *)IVar57,(ImVec2 *)((long)IVar57 + 0x6c),
                     (ImVec2 *)((long)IVar57 + 8));
        }
      }
      p_Var9 = (pIVar46->PlatformIO).Platform_GetWindowDpiScale;
      if ((p_Var9 == (_func_float_ImGuiViewport_ptr *)0x0) || (bVar17 == false)) {
        if (*(short *)((long)IVar57 + 0x7c) == -1) {
          uVar51 = -(uint)(*(float *)((long)IVar57 + 0x28) != 0.0);
          fVar54 = (float)(~uVar51 & 0x3f800000 | (uint)*(float *)((long)IVar57 + 0x28) & uVar51);
          uVar66 = 0;
          uVar67 = 0;
          uVar68 = 0;
        }
        else {
          pIVar27 = ImVector<ImGuiPlatformMonitor>::operator[]
                              (pIVar45,(int)*(short *)((long)IVar57 + 0x7c));
          fVar54 = pIVar27->DpiScale;
          uVar66 = 0;
          uVar67 = 0;
          uVar68 = 0;
        }
      }
      else {
        fVar54 = (*p_Var9)((ImGuiViewport *)IVar57);
        uVar66 = extraout_var._0_4_;
        uVar67 = extraout_var._4_4_;
        uVar68 = extraout_var._8_4_;
      }
      fVar55 = *(float *)((long)IVar57 + 0x28);
      if ((fVar55 != 0.0) || (NAN(fVar55))) {
        if (((fVar54 != fVar55) || (NAN(fVar54) || NAN(fVar55))) &&
           (((pIVar46->IO).ConfigFlags & 0x4000) != 0)) {
          local_48 = fVar54;
          uStack_44 = uVar66;
          uStack_40 = uVar67;
          uStack_3c = uVar68;
          ScaleWindowsInViewport((ImGuiViewportP *)IVar57,fVar54 / fVar55);
          fVar54 = local_48;
        }
      }
      *(float *)((long)IVar57 + 0x28) = fVar54;
      iVar41 = iVar41 + 1;
    }
    else {
      this_00 = &GImGui->Windows;
      for (iVar50 = 0; iVar50 < this_00->Size; iVar50 = iVar50 + 1) {
        ppIVar29 = ImVector<ImGuiWindow_*>::operator[](this_00,iVar50);
        pIVar30 = *ppIVar29;
        if ((ImVec2)pIVar30->Viewport == IVar57) {
          pIVar30->Viewport = (ImGuiViewportP *)0x0;
          pIVar30->ViewportOwned = false;
        }
      }
      if ((ImVec2)pIVar48->MouseLastHoveredViewport == IVar57) {
        pIVar48->MouseLastHoveredViewport = (ImGuiViewportP *)0x0;
      }
      DestroyPlatformWindow((ImGuiViewportP *)IVar57);
      local_78.Min = IVar57;
      bVar17 = ImVector<ImGuiViewport_*>::contains
                         (&(pIVar48->PlatformIO).Viewports,(ImGuiViewport **)&local_78);
      if (bVar17) {
        __assert_fail("g.PlatformIO.Viewports.contains(viewport) == false",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x2f5a,"void ImGui::DestroyViewport(ImGuiViewportP *)");
      }
      pIVar28 = (ImVec2 *)
                ImVector<ImGuiViewportP_*>::operator[]
                          (&pIVar48->Viewports,*(int *)((long)IVar57 + 0x5c));
      if (*pIVar28 != IVar57) {
        __assert_fail("g.Viewports[viewport->Idx] == viewport",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x2f5b,"void ImGui::DestroyViewport(ImGuiViewportP *)");
      }
      ImVector<ImGuiViewportP_*>::erase
                (&pIVar48->Viewports,(pIVar48->Viewports).Data + *(int *)((long)IVar57 + 0x5c));
      IM_DELETE<ImGuiViewportP>((ImGuiViewportP *)IVar57);
    }
  }
  if (pIVar45->Size == 0) {
    (pIVar46->FallbackMonitor).MainPos = (local_98->super_ImGuiViewport).Pos;
    (pIVar46->FallbackMonitor).MainSize = (local_98->super_ImGuiViewport).Size;
    (pIVar46->FallbackMonitor).WorkPos = (local_98->super_ImGuiViewport).WorkPos;
    (pIVar46->FallbackMonitor).WorkSize = (local_98->super_ImGuiViewport).WorkSize;
    (pIVar46->FallbackMonitor).DpiScale = (local_98->super_ImGuiViewport).DpiScale;
  }
  if ((uVar36 >> 10 & 1) == 0) {
LAB_0012b00a:
    pIVar46->MouseViewport = local_98;
  }
  else {
    if (((pIVar46->IO).BackendFlags & 0x800) == 0) {
      IVar57 = (pIVar46->IO).MousePos;
      this_03 = &GImGui->Viewports;
      fVar54 = IVar57.y;
      local_98 = (ImGuiViewportP *)0x0;
      for (iVar41 = 0; iVar41 < this_03->Size; iVar41 = iVar41 + 1) {
        ppIVar26 = ImVector<ImGuiViewportP_*>::operator[](this_03,iVar41);
        pIVar40 = *ppIVar26;
        if (((pIVar40->super_ImGuiViewport).Flags & 0x480) == 0) {
          IVar77 = ImGuiViewportP::GetMainRect(pIVar40);
          local_a8 = IVar57.x;
          if (((((IVar77.Min.x <= local_a8) && (IVar77.Min.y <= fVar54)) &&
               (local_a8 < IVar77.Max.x)) && (fVar54 < IVar77.Max.y)) &&
             ((local_98 == (ImGuiViewportP *)0x0 ||
              (local_98->LastFrontMostStampCount < pIVar40->LastFrontMostStampCount)))) {
            local_98 = pIVar40;
          }
        }
      }
      pIVar48 = local_68;
      if (local_98 == (ImGuiViewportP *)0x0) goto LAB_0012b113;
LAB_0012b102:
      pIVar46->MouseLastHoveredViewport = local_98;
      bVar17 = false;
      pIVar40 = local_98;
    }
    else {
      IVar37 = (pIVar46->IO).MouseHoveredViewport;
      if ((IVar37 != 0) &&
         (local_98 = (ImGuiViewportP *)FindViewportByID(IVar37), local_98 != (ImGuiViewportP *)0x0))
      {
        if (((local_98->super_ImGuiViewport).Flags & 0x80) != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x2ecd,"void ImGui::UpdateViewportsNewFrame()");
        }
        goto LAB_0012b102;
      }
LAB_0012b113:
      local_98 = pIVar46->MouseLastHoveredViewport;
      bVar17 = true;
      if (local_98 == (ImGuiViewportP *)0x0) {
        pIVar40 = (ImGuiViewportP *)0x0;
        ppIVar26 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,0);
        local_98 = *ppIVar26;
        pIVar46->MouseLastHoveredViewport = local_98;
      }
      else {
        pIVar40 = (ImGuiViewportP *)0x0;
      }
    }
    if ((pIVar46->MovingWindow == (ImGuiWindow *)0x0) ||
       (pIVar47 = pIVar46->MovingWindow->Viewport, pIVar47 == (ImGuiViewportP *)0x0)) {
      pIVar47 = local_98;
    }
    if (pIVar46->DragDropActive == false) {
      local_98 = pIVar40;
    }
    if (!bVar17) {
      local_98 = pIVar40;
    }
    pIVar46->MouseViewport = pIVar47;
    pIVar15 = local_98;
    if ((((pIVar46->DragDropActive != false) || (pIVar46->ActiveId == 0)) ||
        (bVar17 = IsAnyMouseDown(), pIVar15 = pIVar40, !bVar17)) &&
       (((pIVar15 != (ImGuiViewportP *)0x0 && (pIVar15 != pIVar47)) &&
        (((local_98->super_ImGuiViewport).Flags & 0x80) == 0)))) goto LAB_0012b00a;
    if (pIVar47 == (ImGuiViewportP *)0x0) {
      __assert_fail("g.MouseViewport != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x2ef1,"void ImGui::UpdateViewportsNewFrame()");
    }
  }
  ((pIVar48->IO).Fonts)->Locked = true;
  font = GetDefaultFont();
  SetCurrentFont(font);
  if (pIVar48->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x102a,"void ImGui::NewFrame()");
  }
  pIVar1 = &pIVar48->Viewports;
  fVar54 = 3.4028235e+38;
  fVar55 = 3.4028235e+38;
  fVar69 = -3.4028235e+38;
  fVar70 = -3.4028235e+38;
  for (iVar41 = 0; iVar41 < pIVar1->Size; iVar41 = iVar41 + 1) {
    ppIVar26 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,iVar41);
    IVar77 = ImGuiViewportP::GetMainRect(*ppIVar26);
    fVar71 = IVar77.Min.x;
    if (fVar54 <= IVar77.Min.x) {
      fVar71 = fVar54;
    }
    fVar54 = IVar77.Min.y;
    if (fVar55 <= IVar77.Min.y) {
      fVar54 = fVar55;
    }
    if (fVar69 < IVar77.Max.x) {
      auVar61._4_4_ = fVar54;
      auVar61._0_4_ = fVar71;
      auVar61._8_4_ = IVar77.Max.x;
    }
    else {
      auVar61._4_4_ = fVar54;
      auVar61._0_4_ = fVar71;
      auVar61._8_4_ = fVar69;
    }
    fVar54 = auVar61._0_4_;
    fVar55 = auVar61._4_4_;
    fVar69 = auVar61._8_4_;
    if (fVar70 < IVar77.Max.y) {
      fVar70 = IVar77.Max.y;
    }
  }
  (pIVar48->DrawListSharedData).ClipRectFullscreen.x = fVar54;
  (pIVar48->DrawListSharedData).ClipRectFullscreen.y = fVar55;
  (pIVar48->DrawListSharedData).ClipRectFullscreen.z = fVar69;
  (pIVar48->DrawListSharedData).ClipRectFullscreen.w = fVar70;
  fVar54 = (pIVar48->Style).CircleTessellationMaxError;
  (pIVar48->DrawListSharedData).CurveTessellationTol = (pIVar48->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&pIVar48->DrawListSharedData,fVar54);
  bVar17 = (pIVar48->Style).AntiAliasedLines;
  uVar36 = (uint)bVar17;
  (pIVar48->DrawListSharedData).InitialFlags = (uint)bVar17;
  if (((pIVar48->Style).AntiAliasedLinesUseTex != false) &&
     ((pIVar48->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar36 = bVar17 | 2;
    (pIVar48->DrawListSharedData).InitialFlags = uVar36;
  }
  if ((pIVar48->Style).AntiAliasedFill == true) {
    uVar36 = uVar36 | 4;
    (pIVar48->DrawListSharedData).InitialFlags = uVar36;
  }
  if (((pIVar48->IO).BackendFlags & 8) != 0) {
    (pIVar48->DrawListSharedData).InitialFlags = uVar36 | 8;
  }
  for (iVar41 = 0; iVar41 < pIVar1->Size; iVar41 = iVar41 + 1) {
    ppIVar26 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,iVar41);
    pIVar40 = *ppIVar26;
    (pIVar40->super_ImGuiViewport).DrawData = (ImDrawData *)0x0;
    (pIVar40->DrawDataP).DisplaySize.x = 0.0;
    (pIVar40->DrawDataP).DisplaySize.y = 0.0;
    (pIVar40->DrawDataP).FramebufferScale.x = 0.0;
    (pIVar40->DrawDataP).FramebufferScale.y = 0.0;
    (pIVar40->DrawDataP).CmdLists = (ImDrawList **)0x0;
    (pIVar40->DrawDataP).DisplayPos.x = 0.0;
    (pIVar40->DrawDataP).DisplayPos.y = 0.0;
    (pIVar40->DrawDataP).Valid = false;
    *(undefined3 *)&(pIVar40->DrawDataP).field_0x1 = 0;
    (pIVar40->DrawDataP).CmdListsCount = 0;
    (pIVar40->DrawDataP).TotalIdxCount = 0;
    (pIVar40->DrawDataP).TotalVtxCount = 0;
    (pIVar40->DrawDataP).OwnerViewport = (ImGuiViewport *)0x0;
  }
  if ((pIVar48->DragDropActive != false) &&
     (IVar37 = (pIVar48->DragDropPayload).SourceId, IVar37 == pIVar48->ActiveId)) {
    KeepAliveID(IVar37);
  }
  if (pIVar48->HoveredIdPreviousFrame == 0) {
    IVar37 = pIVar48->HoveredId;
    pIVar48->HoveredIdTimer = 0.0;
    pIVar48->HoveredIdNotActiveTimer = 0.0;
    if (IVar37 == 0) goto LAB_0012b3cc;
LAB_0012b3a1:
    fVar54 = (pIVar48->IO).DeltaTime;
    pIVar48->HoveredIdTimer = pIVar48->HoveredIdTimer + fVar54;
    IVar22 = IVar37;
    if (pIVar48->ActiveId != IVar37) {
      pIVar48->HoveredIdNotActiveTimer = fVar54 + pIVar48->HoveredIdNotActiveTimer;
      IVar22 = pIVar48->ActiveId;
    }
  }
  else {
    IVar37 = pIVar48->HoveredId;
    if (IVar37 != 0) {
      if (pIVar48->ActiveId == IVar37) {
        pIVar48->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_0012b3a1;
    }
LAB_0012b3cc:
    IVar37 = 0;
    IVar22 = pIVar48->ActiveId;
  }
  pIVar48->HoveredIdPreviousFrame = IVar37;
  pIVar48->HoveredIdPreviousFrameUsingMouseWheel = pIVar48->HoveredIdUsingMouseWheel;
  pIVar48->HoveredId = 0;
  pIVar48->HoveredIdAllowOverlap = false;
  pIVar48->HoveredIdUsingMouseWheel = false;
  pIVar48->HoveredIdDisabled = false;
  if (((pIVar48->ActiveIdIsAlive != IVar22) && (IVar22 != 0)) &&
     (pIVar48->ActiveIdPreviousFrame == IVar22)) {
    ClearActiveID();
    IVar22 = pIVar48->ActiveId;
  }
  fVar54 = (pIVar48->IO).DeltaTime;
  if (IVar22 != 0) {
    pIVar48->ActiveIdTimer = pIVar48->ActiveIdTimer + fVar54;
  }
  pIVar48->LastActiveIdTimer = fVar54 + pIVar48->LastActiveIdTimer;
  pIVar48->ActiveIdPreviousFrame = IVar22;
  pIVar48->ActiveIdPreviousFrameWindow = pIVar48->ActiveIdWindow;
  pIVar48->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar48->ActiveIdHasBeenEditedBefore;
  pIVar48->ActiveIdIsAlive = 0;
  pIVar48->ActiveIdHasBeenEditedThisFrame = false;
  pIVar48->ActiveIdPreviousFrameIsAlive = false;
  pIVar48->ActiveIdIsJustActivated = false;
  if (pIVar48->TempInputId == 0) {
LAB_0012b4c4:
    if (IVar22 == 0) {
      pIVar48->ActiveIdUsingNavDirMask = 0;
      pIVar48->ActiveIdUsingNavInputMask = 0;
      pIVar48->ActiveIdUsingKeyInputMask = 0;
    }
  }
  else if (IVar22 != pIVar48->TempInputId) {
    pIVar48->TempInputId = 0;
    goto LAB_0012b4c4;
  }
  pIVar48->DragDropAcceptIdPrev = pIVar48->DragDropAcceptIdCurr;
  pIVar48->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar48->DragDropAcceptIdCurr = 0;
  pIVar48->DragDropWithinSource = false;
  pIVar48->DragDropWithinTarget = false;
  pIVar48->DragDropHoldJustPressedId = 0;
  if ((pIVar48->IO).AppFocusLost == true) {
    ImGuiIO::ClearInputKeys(local_50);
    (pIVar48->IO).AppFocusLost = false;
  }
  IVar23 = GetMergedKeyModFlags();
  (pIVar48->IO).KeyMods = IVar23;
  memcpy((pIVar48->IO).KeysDownDurationPrev,(pIVar48->IO).KeysDownDuration,0x800);
  for (lVar38 = 0x140; pIVar46 = GImGui, lVar38 != 0x340; lVar38 = lVar38 + 1) {
    fVar54 = -1.0;
    if (*(char *)((long)(pIVar48->IO).KeyMap + lVar38 + -0x3c) == '\x01') {
      fVar55 = *(float *)((long)pIVar48 + lVar38 * 4 + -0x5c);
      fVar54 = 0.0;
      if (0.0 <= fVar55) {
        fVar54 = fVar55 + (pIVar48->IO).DeltaTime;
      }
    }
    *(float *)((long)pIVar48 + lVar38 * 4 + -0x5c) = fVar54;
  }
  (GImGui->IO).WantSetMousePos = false;
  uVar36 = (pIVar46->IO).ConfigFlags;
  if (((uVar36 & 2) == 0) || (((pIVar46->IO).BackendFlags & 1) == 0)) {
    bVar17 = false;
  }
  else {
    bVar17 = true;
    if ((pIVar46->NavInputSource != ImGuiInputSource_Gamepad) &&
       (((0.0 < (pIVar46->IO).NavInputs[0] || (0.0 < (pIVar46->IO).NavInputs[2])) ||
        ((0.0 < (pIVar46->IO).NavInputs[1] ||
         ((((0.0 < (pIVar46->IO).NavInputs[3] || (0.0 < (pIVar46->IO).NavInputs[4])) ||
           (0.0 < (pIVar46->IO).NavInputs[5])) ||
          ((0.0 < (pIVar46->IO).NavInputs[6] || (0.0 < (pIVar46->IO).NavInputs[7])))))))))) {
      pIVar46->NavInputSource = ImGuiInputSource_Gamepad;
    }
  }
  if ((uVar36 & 1) != 0) {
    bVar18 = IsKeyDown((pIVar46->IO).KeyMap[0xc]);
    if (bVar18) {
      (pIVar46->IO).NavInputs[0] = 1.0;
      pIVar46->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar18 = IsKeyDown((pIVar46->IO).KeyMap[0xd]);
    if (bVar18) {
      (pIVar46->IO).NavInputs[2] = 1.0;
      pIVar46->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar18 = IsKeyDown((pIVar46->IO).KeyMap[0xe]);
    if (bVar18) {
      (pIVar46->IO).NavInputs[1] = 1.0;
      pIVar46->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar18 = IsKeyDown((pIVar46->IO).KeyMap[1]);
    if (bVar18) {
      (pIVar46->IO).NavInputs[0x10] = 1.0;
      pIVar46->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar18 = IsKeyDown((pIVar46->IO).KeyMap[2]);
    if (bVar18) {
      (pIVar46->IO).NavInputs[0x11] = 1.0;
      pIVar46->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar18 = IsKeyDown((pIVar46->IO).KeyMap[3]);
    if (bVar18) {
      (pIVar46->IO).NavInputs[0x12] = 1.0;
      pIVar46->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar18 = IsKeyDown((pIVar46->IO).KeyMap[4]);
    if (bVar18) {
      (pIVar46->IO).NavInputs[0x13] = 1.0;
      pIVar46->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar46->IO).KeyCtrl == true) {
      (pIVar46->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar46->IO).KeyShift == true) {
      (pIVar46->IO).NavInputs[0xf] = 1.0;
    }
  }
  pfVar31 = (pIVar46->IO).NavInputsDownDuration;
  pfVar43 = pfVar31;
  pfVar44 = (pIVar46->IO).NavInputsDownDurationPrev;
  for (lVar38 = 0x14; lVar38 != 0; lVar38 = lVar38 + -1) {
    *pfVar44 = *pfVar43;
    pfVar43 = pfVar43 + (ulong)bVar49 * -2 + 1;
    pfVar44 = pfVar44 + (ulong)bVar49 * -2 + 1;
  }
  for (lVar38 = 0; lVar38 != 0x14; lVar38 = lVar38 + 1) {
    fVar54 = -1.0;
    if (0.0 < (pIVar46->IO).NavInputs[lVar38]) {
      fVar54 = 0.0;
      if (0.0 <= pfVar31[lVar38]) {
        fVar54 = pfVar31[lVar38] + (pIVar46->IO).DeltaTime;
      }
    }
    pfVar31[lVar38] = fVar54;
  }
  if (pIVar46->NavInitResultId != 0) {
    NavInitRequestApplyResult();
  }
  pIVar46->NavInitRequest = false;
  pIVar46->NavInitRequestFromMove = false;
  pIVar46->NavInitResultId = 0;
  pIVar46->NavJustMovedToId = 0;
  if (pIVar46->NavMoveSubmitted == true) {
    NavMoveRequestApplyResult();
  }
  pIVar46->NavTabbingInputableRemaining = 0;
  pIVar46->NavMoveSubmitted = false;
  pIVar46->NavMoveScoringItems = false;
  if ((pIVar46->NavMousePosDirty == true) && (pIVar46->NavIdIsAlive == true)) {
    if (((((pIVar46->IO).ConfigFlags & 4) != 0) &&
        (((((pIVar46->IO).BackendFlags & 4) != 0 && (pIVar46->NavDisableHighlight == false)) &&
         (pIVar46->NavDisableMouseHover == true)))) && (pIVar46->NavWindow != (ImGuiWindow *)0x0)) {
      IVar57 = NavCalcPreferredRefPos();
      (pIVar46->IO).MousePosPrev = IVar57;
      (pIVar46->IO).MousePos = IVar57;
      (pIVar46->IO).WantSetMousePos = true;
    }
    pIVar46->NavMousePosDirty = false;
  }
  pIVar46->NavIdIsAlive = false;
  pIVar46->NavJustTabbedId = 0;
  IVar5 = pIVar46->NavLayer;
  if (ImGuiNavLayer_Menu < IVar5) {
    __assert_fail("g.NavLayer == ImGuiNavLayer_Main || g.NavLayer == ImGuiNavLayer_Menu",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x2706,"void ImGui::NavUpdate()");
  }
  pIVar30 = pIVar46->NavWindow;
  pIVar39 = pIVar30;
  if (pIVar30 != (ImGuiWindow *)0x0) {
    for (; pIVar39 != (ImGuiWindow *)0x0; pIVar39 = pIVar39->ParentWindow) {
      if ((pIVar39->RootWindow == pIVar39) || ((pIVar39->Flags & 0x14000000) != 0)) {
        if (pIVar39 != pIVar30) {
          pIVar39->NavLastChildNavWindow = pIVar30;
        }
        break;
      }
    }
    if ((IVar5 == ImGuiNavLayer_Main) && (pIVar30->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar30->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar48 = GImGui;
  pIVar30 = GetTopMostPopupModal();
  if (pIVar30 != (ImGuiWindow *)0x0) {
    pIVar48->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar48->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar48->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar54 = (pIVar48->IO).DeltaTime * -10.0 + pIVar48->NavWindowingHighlightAlpha;
    fVar54 = (float)(-(uint)(0.0 <= fVar54) & (uint)fVar54);
    pIVar48->NavWindowingHighlightAlpha = fVar54;
    if ((pIVar48->DimBgRatio <= 0.0) && (fVar54 <= 0.0)) {
      pIVar48->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  uVar51 = (pIVar48->IO).ConfigFlags;
  if ((pIVar30 == (ImGuiWindow *)0x0) && (pIVar48->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    bVar18 = IsNavInputTest(3,ImGuiInputReadMode_Pressed);
    if ((pIVar48->NavWindowingTarget != (ImGuiWindow *)0x0 || (uVar51 & 1) == 0) ||
       ((pIVar48->IO).KeyCtrl != true)) goto LAB_0012b909;
    bVar19 = IsKeyPressedMap(0,true);
  }
  else {
    bVar18 = false;
LAB_0012b909:
    bVar19 = false;
  }
  if (((bVar18 | bVar19) == 1) &&
     ((pIVar30 = pIVar48->NavWindow, pIVar30 != (ImGuiWindow *)0x0 ||
      (pIVar30 = FindWindowNavFocusable((pIVar48->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
      pIVar30 != (ImGuiWindow *)0x0)))) {
    pIVar30 = pIVar30->RootWindow;
    pIVar48->NavWindowingTargetAnim = pIVar30;
    pIVar48->NavWindowingTarget = pIVar30;
    pIVar48->NavWindowingTimer = 0.0;
    pIVar48->NavWindowingHighlightAlpha = 0.0;
    pIVar48->NavWindowingToggleLayer = bVar18;
    pIVar48->NavInputSource = bVar19 ^ ImGuiInputSource_Gamepad;
  }
  fVar54 = (pIVar48->IO).DeltaTime + pIVar48->NavWindowingTimer;
  pIVar48->NavWindowingTimer = fVar54;
  if (pIVar48->NavWindowingTarget == (ImGuiWindow *)0x0) {
LAB_0012bae2:
    bVar18 = false;
    pIVar30 = (ImGuiWindow *)0x0;
  }
  else {
    IVar24 = pIVar48->NavInputSource;
    if (IVar24 != ImGuiInputSource_Gamepad) {
LAB_0012ba55:
      if (IVar24 == ImGuiInputSource_Keyboard) {
        fVar55 = (pIVar48->NavWindowingTimer + -0.2) / 0.05;
        fVar54 = 1.0;
        if (fVar55 <= 1.0) {
          fVar54 = fVar55;
        }
        fVar54 = (float)(~-(uint)(fVar55 < 0.0) & (uint)fVar54);
        uVar52 = -(uint)(fVar54 <= pIVar48->NavWindowingHighlightAlpha);
        pIVar48->NavWindowingHighlightAlpha =
             (float)(uVar52 & (uint)pIVar48->NavWindowingHighlightAlpha | ~uVar52 & (uint)fVar54);
        bVar18 = IsKeyPressedMap(0,true);
        if (bVar18) {
          NavUpdateWindowingHighlightWindow((pIVar48->IO).KeyShift - 1 | 1);
        }
        if ((pIVar48->IO).KeyCtrl == false) {
          pIVar30 = pIVar48->NavWindowingTarget;
          bVar18 = false;
          goto LAB_0012bae7;
        }
      }
      goto LAB_0012bae2;
    }
    fVar55 = (fVar54 + -0.2) / 0.05;
    fVar54 = 1.0;
    if (fVar55 <= 1.0) {
      fVar54 = fVar55;
    }
    fVar54 = (float)(~-(uint)(fVar55 < 0.0) & (uint)fVar54);
    uVar52 = -(uint)(fVar54 <= pIVar48->NavWindowingHighlightAlpha);
    pIVar48->NavWindowingHighlightAlpha =
         (float)(uVar52 & (uint)pIVar48->NavWindowingHighlightAlpha | ~uVar52 & (uint)fVar54);
    bVar18 = IsNavInputTest(0xc,ImGuiInputReadMode_RepeatSlow);
    bVar19 = IsNavInputTest(0xd,ImGuiInputReadMode_RepeatSlow);
    if ((uint)bVar18 - (uint)bVar19 != 0) {
      NavUpdateWindowingHighlightWindow((uint)bVar18 - (uint)bVar19);
      pIVar48->NavWindowingHighlightAlpha = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) {
      if (pIVar48->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_0012bae2;
      IVar24 = pIVar48->NavInputSource;
      goto LAB_0012ba55;
    }
    pbVar42 = &pIVar48->NavWindowingToggleLayer;
    *pbVar42 = (bool)(*pbVar42 &
                     (pIVar48->NavWindowingHighlightAlpha <= 1.0 &&
                     pIVar48->NavWindowingHighlightAlpha != 1.0));
    if (*pbVar42 == false) {
      pIVar30 = pIVar48->NavWindowingTarget;
      bVar18 = false;
    }
    else {
      bVar18 = pIVar48->NavWindow != (ImGuiWindow *)0x0;
      pIVar30 = (ImGuiWindow *)0x0;
    }
    pIVar48->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_0012bae7:
  if ((((uVar51 & 1) != 0) && ((pIVar48->IO).KeyMods == 4)) &&
     (((pIVar48->IO).KeyModsPrev & 4) == 0)) {
    pIVar48->NavWindowingToggleLayer = true;
    pIVar48->NavInputSource = ImGuiInputSource_Keyboard;
  }
  if ((pIVar48->NavWindowingToggleLayer == true) &&
     (pIVar48->NavInputSource == ImGuiInputSource_Keyboard)) {
    if (((0 < (pIVar48->IO).InputQueueCharacters.Size) ||
        (((pIVar48->IO).KeyCtrl != false || ((pIVar48->IO).KeyShift != false)))) ||
       (bVar19 = true, (pIVar48->IO).KeySuper == true)) {
      pIVar48->NavWindowingToggleLayer = false;
      bVar19 = false;
    }
    if ((((((pIVar48->IO).KeyMods & 4) == 0) && (((pIVar48->IO).KeyModsPrev & 4) != 0)) && (bVar19))
       && ((pIVar48->ActiveId == 0 || (pIVar48->ActiveIdAllowOverlap == true)))) {
      bVar19 = IsMousePosValid(&(pIVar48->IO).MousePos);
      bVar20 = IsMousePosValid(&(pIVar48->IO).MousePosPrev);
      bVar18 = (bool)(bVar18 | bVar20 == bVar19);
    }
    if ((pIVar48->IO).KeyAlt == false) {
      pIVar48->NavWindowingToggleLayer = false;
    }
  }
  pIVar39 = pIVar48->NavWindowingTarget;
  if ((pIVar39 != (ImGuiWindow *)0x0) && ((pIVar39->Flags & 4) == 0)) {
    if (pIVar48->NavInputSource == ImGuiInputSource_Gamepad) {
      dir_sources = 4;
LAB_0012bd2c:
      IVar57 = GetNavInputAmount2d(dir_sources,ImGuiInputReadMode_Down,0.0,0.0);
    }
    else {
      IVar57.x = 0.0;
      IVar57.y = 0.0;
      if ((pIVar48->NavInputSource == ImGuiInputSource_Keyboard) &&
         ((pIVar48->IO).KeyShift == false)) {
        dir_sources = 1;
        goto LAB_0012bd2c;
      }
    }
    fVar54 = IVar57.x;
    fVar55 = IVar57.y;
    if ((((fVar54 != 0.0) || (NAN(fVar54))) || (fVar55 != 0.0)) || (NAN(fVar55))) {
      fVar69 = (pIVar48->IO).DisplayFramebufferScale.x;
      fVar70 = (pIVar48->IO).DisplayFramebufferScale.y;
      if (fVar70 <= fVar69) {
        fVar69 = fVar70;
      }
      fVar69 = (float)(int)(fVar69 * (pIVar48->IO).DeltaTime * 800.0);
      pIVar39 = pIVar39->RootWindowDockTree;
      local_78.Min.y = (pIVar39->Pos).y + fVar55 * fVar69;
      local_78.Min.x = (pIVar39->Pos).x + fVar54 * fVar69;
      SetWindowPos(pIVar39,&local_78.Min,1);
      MarkIniSettingsDirty(pIVar39);
      pIVar48->NavDisableMouseHover = true;
    }
  }
  if (pIVar30 != (ImGuiWindow *)0x0) {
    pIVar39 = pIVar48->NavWindow;
    if (pIVar39 == (ImGuiWindow *)0x0) {
      pIVar40 = (ImGuiViewportP *)0x0;
LAB_0012bddb:
      ClearActiveID();
      pIVar48->NavDisableHighlight = false;
      pIVar48->NavDisableMouseHover = true;
      pIVar30 = NavRestoreLastChildNavWindow(pIVar30);
      ClosePopupsOverWindow(pIVar30,false);
      FocusWindow(pIVar30);
      if (pIVar30->NavLastIds[0] == 0) {
        NavInitWindow(pIVar30,false);
      }
      if ((pIVar30->DC).NavLayersActiveMaskNext == 2) {
        pIVar48->NavLayer = ImGuiNavLayer_Menu;
      }
      if ((pIVar30->Viewport != pIVar40) &&
         (p_Var10 = (pIVar48->PlatformIO).Platform_SetWindowFocus,
         p_Var10 != (_func_void_ImGuiViewport_ptr *)0x0)) {
        (*p_Var10)(&pIVar30->Viewport->super_ImGuiViewport);
      }
    }
    else if (pIVar30 != pIVar39->RootWindow) {
      pIVar40 = pIVar39->Viewport;
      goto LAB_0012bddb;
    }
    pIVar48->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar18) && (pIVar48->NavWindow != (ImGuiWindow *)0x0)) {
    ClearActiveID();
    pIVar30 = pIVar48->NavWindow;
    pIVar39 = pIVar30;
    do {
      window_00 = pIVar39;
      if ((window_00->ParentWindow == (ImGuiWindow *)0x0) ||
         (((window_00->DC).NavLayersActiveMask & 2) != 0)) break;
      pIVar39 = window_00->ParentWindow;
    } while ((window_00->Flags & 0x15000000U) == 0x1000000);
    if (window_00 != pIVar30) {
      FocusWindow(window_00);
      window_00->NavLastChildNavWindow = pIVar30;
      pIVar30 = pIVar48->NavWindow;
    }
    IVar5 = pIVar48->NavLayer;
    if (((pIVar30->DC).NavLayersActiveMask & 2) == 0) {
      layer = ImGuiNavLayer_Main;
      if (IVar5 == ImGuiNavLayer_Main) goto LAB_0012bf21;
    }
    else if (IVar5 == ImGuiNavLayer_Main) {
      layer = ImGuiNavLayer_Menu;
      if (window_00->DockNodeAsHost == (ImGuiDockNode *)0x0) {
        pIVar30->NavLastIds[1] = 0;
      }
    }
    else {
      layer = IVar5 ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(layer);
  }
LAB_0012bf21:
  if (((uVar36 & 1) == 0 && !bVar17) || (pIVar46->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar46->IO).NavActive = false;
LAB_0012bf6e:
    bVar18 = pIVar46->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar18 = (pIVar46->NavWindow->Flags & 0x40000U) == 0;
    (pIVar46->IO).NavActive = bVar18;
    if (((!bVar18) || (pIVar46->NavId == 0)) ||
       (bVar18 = true, pIVar46->NavDisableHighlight != false)) goto LAB_0012bf6e;
  }
  (pIVar46->IO).NavVisible = bVar18;
  pIVar48 = GImGui;
  bVar18 = IsNavInputTest(1,ImGuiInputReadMode_Pressed);
  if (bVar18) {
    if (pIVar48->ActiveId == 0) {
      if (pIVar48->NavLayer == ImGuiNavLayer_Main) {
        pIVar30 = pIVar48->NavWindow;
        if (pIVar30 == (ImGuiWindow *)0x0) {
          if ((pIVar48->OpenPopupStack).Size < 1) goto LAB_0012d381;
LAB_0012d293:
          pIVar34 = ImVector<ImGuiPopupData>::back(&pIVar48->OpenPopupStack);
          if ((pIVar34->Window->Flags & 0x8000000) == 0) {
            ClosePopupToLevel((pIVar48->OpenPopupStack).Size + -1,true);
          }
        }
        else if (((pIVar30 == pIVar30->RootWindow) || ((pIVar30->Flags & 0x4000000) != 0)) ||
                (pIVar39 = pIVar30->ParentWindow, pIVar39 == (ImGuiWindow *)0x0)) {
          if (0 < (pIVar48->OpenPopupStack).Size) goto LAB_0012d293;
          if ((pIVar30->Flags & 0x5000000U) != 0x1000000) {
            pIVar30->NavLastIds[0] = 0;
          }
LAB_0012d381:
          pIVar48->NavId = 0;
          pIVar48->NavFocusScopeId = 0;
        }
        else {
          if (pIVar30->ChildId == 0) {
            __assert_fail("child_window->ChildId != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                          ,0x285a,"void ImGui::NavUpdateCancelRequest()");
          }
          IVar77 = ImGuiWindow::Rect(pIVar30);
          FocusWindow(pIVar39);
          local_a8 = IVar77.Min.x;
          fStack_a4 = IVar77.Min.y;
          fVar54 = (pIVar39->Pos).x;
          fVar55 = (pIVar39->Pos).y;
          local_b8 = IVar77.Max.x;
          fStack_b4 = IVar77.Max.y;
          local_78.Max.x = local_b8 - fVar54;
          local_78.Max.y = fStack_b4 - fVar55;
          local_78.Min.y = fStack_a4 - fVar55;
          local_78.Min.x = local_a8 - fVar54;
          SetNavID(pIVar30->ChildId,ImGuiNavLayer_Main,0,&local_78);
        }
      }
      else {
        NavRestoreLayer(ImGuiNavLayer_Main);
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
  pIVar46->NavActivateFlags = 0;
  pIVar46->NavActivateId = 0;
  pIVar46->NavActivateDownId = 0;
  pIVar46->NavActivatePressedId = 0;
  pIVar46->NavActivateInputId = 0;
  if (((pIVar46->NavId == 0) || (pIVar46->NavDisableHighlight != false)) ||
     (pIVar46->NavWindowingTarget != (ImGuiWindow *)0x0)) {
LAB_0012c00f:
    if ((pIVar46->NavWindow != (ImGuiWindow *)0x0) && ((pIVar46->NavWindow->Flags & 0x40000) != 0))
    {
      pIVar46->NavDisableHighlight = true;
    }
  }
  else if (pIVar46->NavWindow != (ImGuiWindow *)0x0) {
    if ((pIVar46->NavWindow->Flags & 0x40000) != 0) goto LAB_0012c00f;
    fVar54 = (GImGui->IO).NavInputs[0];
    fVar55 = (GImGui->IO).NavInputs[2];
    if (0.0 < fVar54) {
      bVar18 = IsNavInputTest(0,ImGuiInputReadMode_Pressed);
    }
    else {
      bVar18 = false;
    }
    if (fVar55 <= 0.0) {
      bVar19 = false;
    }
    else {
      bVar19 = IsNavInputTest(2,ImGuiInputReadMode_Pressed);
    }
    IVar37 = pIVar46->ActiveId;
    if (bVar18 == true && IVar37 == 0) {
      pIVar46->NavActivateId = pIVar46->NavId;
      pIVar46->NavActivateFlags = 2;
LAB_0012d452:
      if (bVar19 != false) {
        pIVar46->NavActivateInputId = pIVar46->NavId;
        pIVar46->NavActivateFlags = 1;
      }
      if (0.0 < fVar54) {
        pIVar46->NavActivateDownId = pIVar46->NavId;
      }
      if (bVar18 == false) goto LAB_0012c00f;
      IVar37 = pIVar46->NavId;
    }
    else {
      if (IVar37 == 0) goto LAB_0012d452;
      IVar22 = pIVar46->NavId;
      if ((bVar19 & IVar37 == IVar22) != 0) {
        pIVar46->NavActivateInputId = IVar37;
        pIVar46->NavActivateFlags = 1;
      }
      if (IVar37 == IVar22 && 0.0 < fVar54) {
        pIVar46->NavActivateDownId = IVar37;
      }
      if ((bVar18 & IVar37 == IVar22) == 0) goto LAB_0012c00f;
    }
    pIVar46->NavActivatePressedId = IVar37;
    goto LAB_0012c00f;
  }
  if ((pIVar46->NavActivateId != 0) && (pIVar46->NavActivateDownId != pIVar46->NavActivateId)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x2733,"void ImGui::NavUpdate()");
  }
  IVar37 = pIVar46->NavNextActivateId;
  if (IVar37 != 0) {
    if ((pIVar46->NavNextActivateFlags & 1U) == 0) {
      pIVar46->NavActivatePressedId = IVar37;
      pIVar46->NavActivateDownId = IVar37;
      pIVar46->NavActivateId = IVar37;
    }
    else {
      pIVar46->NavActivateInputId = IVar37;
    }
    pIVar46->NavActivateFlags = pIVar46->NavNextActivateFlags;
  }
  pIVar46->NavNextActivateId = 0;
  pIVar48 = GImGui;
  pIVar30 = GImGui->NavWindow;
  if ((pIVar30 != (ImGuiWindow *)0x0 & GImGui->NavMoveForwardToNextFrame) == 1) {
    iVar41 = GImGui->NavMoveDir;
    if ((iVar41 == -1) || (GImGui->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x278d,"void ImGui::NavUpdateCreateMoveRequest()");
    }
    if ((GImGui->NavMoveFlags & 0x80) == 0) {
      __assert_fail("g.NavMoveFlags & ImGuiNavMoveFlags_Forwarded",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x278e,"void ImGui::NavUpdateCreateMoveRequest()");
    }
LAB_0012c204:
    pIVar16 = GImGui;
    if ((((iVar41 != -1) || (((pIVar48->IO).ConfigFlags & 1U) == 0)) ||
        (pIVar39 = GImGui->NavWindow, (pIVar39->Flags & 0x40000) != 0)) ||
       (GImGui->NavWindowingTarget != (ImGuiWindow *)0x0)) goto LAB_0012c2e0;
    local_a8 = 0.0;
    if (GImGui->NavLayer == ImGuiNavLayer_Main) {
      bVar19 = IsKeyDown((GImGui->IO).KeyMap[5]);
      bVar18 = false;
      bVar20 = false;
      if (bVar19) {
        bVar20 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
      }
      bVar19 = IsKeyDown((pIVar16->IO).KeyMap[6]);
      if (bVar19) {
        bVar18 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
      }
      bVar19 = IsKeyPressed((pIVar16->IO).KeyMap[7],true);
      if (bVar19) {
        bVar19 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
      }
      else {
        bVar19 = false;
      }
      bVar21 = IsKeyPressed((pIVar16->IO).KeyMap[8],true);
      if (bVar21) {
        bVar21 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
      }
      else {
        bVar21 = false;
      }
      if ((bVar20 != bVar18) || (bVar19 != bVar21)) {
        if (((pIVar39->DC).NavLayersActiveMask == 0) && ((pIVar39->DC).NavHasScroll == true)) {
          bVar18 = IsKeyPressed((pIVar16->IO).KeyMap[5],true);
          if (bVar18) {
            (pIVar39->ScrollTarget).y =
                 (pIVar39->Scroll).y - ((pIVar39->InnerRect).Max.y - (pIVar39->InnerRect).Min.y);
            (pIVar39->ScrollTargetCenterRatio).y = 0.0;
            (pIVar39->ScrollTargetEdgeSnapDist).y = 0.0;
          }
          else {
            bVar18 = IsKeyPressed((pIVar16->IO).KeyMap[6],true);
            if (bVar18) {
              fVar54 = ((pIVar39->InnerRect).Max.y - (pIVar39->InnerRect).Min.y) +
                       (pIVar39->Scroll).y;
LAB_0012d859:
              (pIVar39->ScrollTarget).y = fVar54;
            }
            else {
              if (bVar19 == false) {
                if (bVar21 == false) goto LAB_0012c2e8;
                fVar54 = (pIVar39->ScrollMax).y;
                goto LAB_0012d859;
              }
              (pIVar39->ScrollTarget).y = 0.0;
            }
            (pIVar39->ScrollTargetCenterRatio).y = 0.0;
            (pIVar39->ScrollTargetEdgeSnapDist).y = 0.0;
          }
        }
        else {
          IVar5 = pIVar16->NavLayer;
          fVar54 = (pIVar39->InnerRect).Max.y;
          fVar55 = (pIVar39->InnerRect).Min.y;
          fVar69 = ImGuiWindow::CalcFontSize(pIVar39);
          local_a8 = (pIVar39->NavRectRel[IVar5].Max.y - pIVar39->NavRectRel[IVar5].Min.y) +
                     ((fVar54 - fVar55) - fVar69);
          local_a8 = (float)(~-(uint)(local_a8 <= 0.0) & (uint)local_a8);
          bVar18 = IsKeyPressed((pIVar16->IO).KeyMap[5],true);
          if (bVar18) {
            local_a8 = -local_a8;
            pIVar16->NavMoveDir = 3;
            pIVar16->NavMoveClipDir = 2;
          }
          else {
            bVar18 = IsKeyPressed((pIVar16->IO).KeyMap[6],true);
            if (!bVar18) {
              pIVar35 = pIVar39->NavRectRel + IVar5;
              if (bVar19 == false) {
                if (bVar21 != false) {
                  local_a8 = 0.0;
                  fVar54 = ((pIVar39->ScrollMax).y + (pIVar39->SizeFull).y) - (pIVar39->Scroll).y;
                  pIVar39->NavRectRel[IVar5].Max.y = fVar54;
                  pIVar39->NavRectRel[IVar5].Min.y = fVar54;
                  fVar54 = (pIVar35->Min).x;
                  pIVar28 = &pIVar39->NavRectRel[IVar5].Max;
                  if (pIVar28->x <= fVar54 && fVar54 != pIVar28->x) {
                    pIVar39->NavRectRel[IVar5].Max.x = 0.0;
                    (pIVar35->Min).x = 0.0;
                  }
                  pIVar16->NavMoveDir = 2;
                  pIVar16->NavMoveFlags = 0x50;
                  goto LAB_0012c2e8;
                }
              }
              else {
                fVar54 = -(pIVar39->Scroll).y;
                pIVar39->NavRectRel[IVar5].Max.y = fVar54;
                pIVar39->NavRectRel[IVar5].Min.y = fVar54;
                fVar54 = (pIVar35->Min).x;
                pIVar28 = &pIVar39->NavRectRel[IVar5].Max;
                if (pIVar28->x <= fVar54 && fVar54 != pIVar28->x) {
                  pIVar39->NavRectRel[IVar5].Max.x = 0.0;
                  (pIVar35->Min).x = 0.0;
                }
                pIVar16->NavMoveDir = 3;
                pIVar16->NavMoveFlags = 0x50;
              }
              goto LAB_0012c2e0;
            }
            pIVar16->NavMoveDir = 2;
            pIVar16->NavMoveClipDir = 3;
          }
          pIVar16->NavMoveFlags = 0x30;
        }
      }
    }
  }
  else {
    GImGui->NavMoveDir = -1;
    pIVar48->NavMoveFlags = 0;
    pIVar48->NavMoveScrollFlags = 0;
    if (pIVar30 != (ImGuiWindow *)0x0) {
      if ((pIVar48->NavWindowingTarget == (ImGuiWindow *)0x0) && ((pIVar30->Flags & 0x40000) == 0))
      {
        if (((pIVar48->ActiveIdUsingNavDirMask & 1) == 0) &&
           ((bVar18 = IsNavInputTest(4,ImGuiInputReadMode_Repeat), bVar18 ||
            (bVar18 = IsNavInputTest(0x10,ImGuiInputReadMode_Repeat), bVar18)))) {
          pIVar48->NavMoveDir = 0;
        }
        if (((GImGui->ActiveIdUsingNavDirMask & 2) == 0) &&
           ((bVar18 = IsNavInputTest(5,ImGuiInputReadMode_Repeat), bVar18 ||
            (bVar18 = IsNavInputTest(0x11,ImGuiInputReadMode_Repeat), bVar18)))) {
          pIVar48->NavMoveDir = 1;
        }
        if (((GImGui->ActiveIdUsingNavDirMask & 4) == 0) &&
           ((bVar18 = IsNavInputTest(6,ImGuiInputReadMode_Repeat), bVar18 ||
            (bVar18 = IsNavInputTest(0x12,ImGuiInputReadMode_Repeat), bVar18)))) {
          pIVar48->NavMoveDir = 2;
        }
        if (((GImGui->ActiveIdUsingNavDirMask & 8) == 0) &&
           ((bVar18 = IsNavInputTest(7,ImGuiInputReadMode_Repeat), bVar18 ||
            (bVar18 = IsNavInputTest(0x13,ImGuiInputReadMode_Repeat), bVar18)))) {
          pIVar48->NavMoveDir = 3;
        }
      }
      iVar41 = pIVar48->NavMoveDir;
      pIVar48->NavMoveClipDir = iVar41;
      goto LAB_0012c204;
    }
    pIVar48->NavMoveClipDir = -1;
LAB_0012c2e0:
    local_a8 = 0.0;
  }
LAB_0012c2e8:
  pIVar48->NavMoveForwardToNextFrame = false;
  if (pIVar48->NavMoveDir != -1) {
    NavMoveRequestSubmit
              (pIVar48->NavMoveDir,pIVar48->NavMoveClipDir,pIVar48->NavMoveFlags,
               pIVar48->NavMoveScrollFlags);
  }
  if (pIVar48->NavMoveSubmitted == true) {
    if (pIVar48->NavId == 0) {
      pIVar48->NavInitRequest = true;
      pIVar48->NavInitRequestFromMove = true;
      pIVar48->NavInitResultId = 0;
      pIVar48->NavDisableHighlight = false;
    }
    if ((pIVar48->NavInputSource != ImGuiInputSource_Gamepad) ||
       (pIVar48->NavLayer != ImGuiNavLayer_Main || pIVar30 == (ImGuiWindow *)0x0))
    goto LAB_0012c405;
    IVar57 = (pIVar30->InnerRect).Min;
    IVar56 = (pIVar30->InnerRect).Max;
    fVar54 = (pIVar30->Pos).x;
    fVar55 = (pIVar30->Pos).y;
    local_78.Max.x = (IVar56.x - fVar54) + 1.0;
    local_78.Max.y = (IVar56.y - fVar55) + 1.0;
    local_78.Min.y = (IVar57.y - fVar55) + -1.0;
    local_78.Min.x = (IVar57.x - fVar54) + -1.0;
    bVar18 = ImRect::Contains(&local_78,pIVar30->NavRectRel);
    if (!bVar18) {
      fVar54 = ImGuiWindow::CalcFontSize(pIVar30);
      auVar64._0_4_ = fVar54 * 0.5;
      auVar72._0_4_ = local_78.Max.x - local_78.Min.x;
      auVar72._4_4_ = local_78.Max.y - local_78.Min.y;
      auVar72._8_4_ = local_78.Max.x - local_78.Max.x;
      auVar72._12_4_ = local_78.Max.y - local_78.Max.y;
      auVar64._4_4_ = auVar64._0_4_;
      auVar64._8_4_ = auVar64._0_4_;
      auVar64._12_4_ = auVar64._0_4_;
      auVar73 = minps(auVar72,auVar64);
      local_78.Max.x = local_78.Max.x - auVar73._0_4_;
      local_78.Max.y = local_78.Max.y - auVar73._4_4_;
      local_78.Min.y = auVar73._4_4_ + local_78.Min.y;
      local_78.Min.x = auVar73._0_4_ + local_78.Min.x;
      ImRect::ClipWithFull(pIVar30->NavRectRel + pIVar48->NavLayer,&local_78);
      pIVar48->NavId = 0;
      pIVar48->NavFocusScopeId = 0;
    }
LAB_0012c40e:
    IVar5 = pIVar48->NavLayer;
    fVar54 = pIVar30->NavRectRel[IVar5].Min.x;
    fVar69 = pIVar30->NavRectRel[IVar5].Max.x;
    if (fVar69 < fVar54) {
LAB_0012c44a:
      fVar70 = 0.0;
      fVar69 = 0.0;
      fVar55 = 0.0;
      fVar54 = 0.0;
    }
    else {
      fVar55 = pIVar30->NavRectRel[IVar5].Min.y;
      fVar70 = pIVar30->NavRectRel[IVar5].Max.y;
      if (fVar70 < fVar55) goto LAB_0012c44a;
    }
    fVar71 = (pIVar30->Pos).y;
    fVar55 = fVar55 + fVar71 + local_a8;
    local_a8 = fVar70 + fVar71 + local_a8;
    if (local_a8 < fVar55) {
      __assert_fail("!scoring_rect.IsInverted()",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x27db,"void ImGui::NavUpdateCreateMoveRequest()");
    }
    fVar70 = (pIVar30->Pos).x;
    fVar69 = fVar69 + fVar70;
    fVar54 = fVar54 + fVar70 + 1.0;
    if (fVar69 <= fVar54) {
      fVar54 = fVar69;
    }
  }
  else {
LAB_0012c405:
    if (pIVar30 != (ImGuiWindow *)0x0) goto LAB_0012c40e;
    local_a8 = 0.0;
    fVar55 = 0.0;
    fVar54 = 0.0;
  }
  (pIVar48->NavScoringRect).Min.x = fVar54;
  (pIVar48->NavScoringRect).Min.y = fVar55;
  (pIVar48->NavScoringRect).Max.x = fVar54;
  (pIVar48->NavScoringRect).Max.y = local_a8;
  NavUpdateAnyRequestFlag();
  pIVar30 = pIVar46->NavWindow;
  if (((pIVar30 != (ImGuiWindow *)0x0) && ((pIVar30->Flags & 0x40000) == 0)) &&
     (pIVar46->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar54 = ImGuiWindow::CalcFontSize(pIVar30);
    fVar54 = (float)(int)(fVar54 * 100.0 * (pIVar46->IO).DeltaTime + 0.5);
    if (((pIVar30->DC).NavLayersActiveMask == 0) &&
       (uVar51 = pIVar46->NavMoveDir, (uVar51 != 0xffffffff & (pIVar30->DC).NavHasScroll) == 1)) {
      if (uVar51 < 2) {
        (pIVar30->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_0019dd48 + (ulong)(uVar51 == 0) * 4) * fVar54 +
                         (pIVar30->Scroll).x);
        (pIVar30->ScrollTargetCenterRatio).x = 0.0;
        (pIVar30->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((uVar51 & 0xfffffffe) == 2) {
        (pIVar30->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_0019dd48 + (ulong)(uVar51 == 2) * 4) * fVar54 +
                         (pIVar30->Scroll).y);
        (pIVar30->ScrollTargetCenterRatio).y = 0.0;
        (pIVar30->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
    IVar57 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar55 = IVar57.x;
    fVar69 = IVar57.y;
    if (((fVar55 != 0.0) || (NAN(fVar55))) && (pIVar30->ScrollbarX == true)) {
      (pIVar30->ScrollTarget).x = (float)(int)(fVar55 * fVar54 + (pIVar30->Scroll).x);
      (pIVar30->ScrollTargetCenterRatio).x = 0.0;
      (pIVar30->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    if ((fVar69 != 0.0) || (NAN(fVar69))) {
      (pIVar30->ScrollTarget).y = (float)(int)(fVar69 * fVar54 + (pIVar30->Scroll).y);
      (pIVar30->ScrollTargetCenterRatio).y = 0.0;
      (pIVar30->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  if ((uVar36 & 1) == 0 && !bVar17) {
    pIVar46->NavMousePosDirty = false;
    pIVar46->NavDisableHighlight = true;
    pIVar46->NavDisableMouseHover = false;
  }
  pIVar46->NavScoringDebugCount = 0;
  pIVar48 = GImGui;
  pIVar28 = &(GImGui->IO).MousePos;
  bVar17 = IsMousePosValid(pIVar28);
  if (bVar17) {
    IVar57 = (pIVar48->IO).MousePos;
    IVar56.x = (float)(int)IVar57.x;
    IVar56.y = (float)(int)IVar57.y;
    pIVar48->MouseLastValidPos = IVar56;
    (pIVar48->IO).MousePos = IVar56;
  }
  bVar17 = IsMousePosValid(pIVar28);
  if ((bVar17) && (bVar17 = IsMousePosValid(&(pIVar48->IO).MousePosPrev), bVar17)) {
    IVar57 = (pIVar48->IO).MousePos;
    IVar56 = (pIVar48->IO).MousePosPrev;
    IVar58.x = IVar57.x - IVar56.x;
    IVar58.y = IVar57.y - IVar56.y;
    (pIVar48->IO).MouseDelta = IVar58;
    if ((((IVar58.x != 0.0) || (NAN(IVar58.x))) || (IVar58.y != 0.0)) || (NAN(IVar58.y))) {
      pIVar48->NavDisableMouseHover = false;
    }
  }
  else {
    (pIVar48->IO).MouseDelta.x = 0.0;
    (pIVar48->IO).MouseDelta.y = 0.0;
  }
  (pIVar48->IO).MousePosPrev = (pIVar48->IO).MousePos;
  for (lVar38 = 0; pIVar46 = local_68, lVar38 != 5; lVar38 = lVar38 + 1) {
    if ((pIVar48->IO).MouseDown[lVar38] == true) {
      fVar54 = (pIVar48->IO).MouseDownDuration[lVar38];
      pbVar42 = (pIVar48->IO).MouseClicked + lVar38;
      *pbVar42 = fVar54 < 0.0;
      pbVar42[10] = false;
      (pIVar48->IO).MouseDownDurationPrev[lVar38] = fVar54;
      if (0.0 <= fVar54) {
        (pIVar48->IO).MouseDownDuration[lVar38] = fVar54 + (pIVar48->IO).DeltaTime;
        (pIVar48->IO).MouseDoubleClicked[lVar38] = false;
        bVar17 = IsMousePosValid(pIVar28);
        auVar65 = ZEXT816(0);
        if (bVar17) {
          IVar57 = (pIVar48->IO).MousePos;
          IVar56 = (pIVar48->IO).MouseClickedPos[lVar38];
          auVar65._0_4_ = IVar57.x - IVar56.x;
          auVar65._4_4_ = IVar57.y - IVar56.y;
          auVar65._8_8_ = 0;
        }
        fVar54 = (pIVar48->IO).MouseDragMaxDistanceSqr[lVar38];
        fVar55 = auVar65._0_4_ * auVar65._0_4_ + auVar65._4_4_ * auVar65._4_4_;
        uVar36 = -(uint)(fVar55 <= fVar54);
        (pIVar48->IO).MouseDragMaxDistanceSqr[lVar38] =
             (float)(~uVar36 & (uint)fVar55 | (uint)fVar54 & uVar36);
        IVar57 = (pIVar48->IO).MouseDragMaxDistanceAbs[lVar38];
        fVar54 = IVar57.x;
        fVar55 = IVar57.y;
        auVar74._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
        auVar74._8_4_ = auVar65._8_4_ ^ 0x80000000;
        auVar74._12_4_ = auVar65._12_4_ ^ 0x80000000;
        auVar73 = maxps(auVar74,auVar65);
        uVar36 = -(uint)(auVar73._0_4_ <= fVar54);
        uVar51 = -(uint)(auVar73._4_4_ <= fVar55);
        (pIVar48->IO).MouseDragMaxDistanceAbs[lVar38] =
             (ImVec2)(CONCAT44(~uVar51 & (uint)auVar73._4_4_,~uVar36 & (uint)auVar73._0_4_) |
                     CONCAT44((uint)fVar55 & uVar51,(uint)fVar54 & uVar36));
      }
      else {
        (pIVar48->IO).MouseDownDuration[lVar38] = 0.0;
        (pIVar48->IO).MouseDoubleClicked[lVar38] = false;
        dVar59 = pIVar48->Time;
        if ((float)(dVar59 - (pIVar48->IO).MouseClickedTime[lVar38]) <
            (pIVar48->IO).MouseDoubleClickTime) {
          bVar17 = IsMousePosValid(pIVar28);
          fVar54 = 0.0;
          fVar55 = 0.0;
          if (bVar17) {
            IVar57 = (pIVar48->IO).MousePos;
            IVar56 = (pIVar48->IO).MouseClickedPos[lVar38];
            fVar54 = IVar57.x - IVar56.x;
            fVar55 = IVar57.y - IVar56.y;
          }
          fVar69 = (pIVar48->IO).MouseDoubleClickMaxDist;
          if (fVar54 * fVar54 + fVar55 * fVar55 < fVar69 * fVar69) {
            (pIVar48->IO).MouseDoubleClicked[lVar38] = true;
          }
          dVar59 = (double)((pIVar48->IO).MouseDoubleClickTime * -2.0);
        }
        (pIVar48->IO).MouseClickedTime[lVar38] = dVar59;
        (pIVar48->IO).MouseClickedPos[lVar38] = (pIVar48->IO).MousePos;
        (pIVar48->IO).MouseDownWasDoubleClick[lVar38] = (pIVar48->IO).MouseDoubleClicked[lVar38];
        pIVar4 = (pIVar48->IO).MouseDragMaxDistanceAbs + lVar38;
        pIVar4->x = 0.0;
        pIVar4->y = 0.0;
        (pIVar48->IO).MouseDragMaxDistanceSqr[lVar38] = 0.0;
      }
    }
    else {
      (pIVar48->IO).MouseClicked[lVar38] = false;
      fVar54 = (pIVar48->IO).MouseDownDuration[lVar38];
      (pIVar48->IO).MouseReleased[lVar38] = 0.0 <= fVar54;
      pbVar42 = (pIVar48->IO).MouseClicked + lVar38;
      (pIVar48->IO).MouseDownDurationPrev[lVar38] = fVar54;
      (pIVar48->IO).MouseDownDuration[lVar38] = -1.0;
      (pIVar48->IO).MouseDoubleClicked[lVar38] = false;
    }
    if (((pIVar48->IO).MouseDown[lVar38] == false) && ((pIVar48->IO).MouseReleased[lVar38] == false)
       ) {
      (pIVar48->IO).MouseDownWasDoubleClick[lVar38] = false;
    }
    if (*pbVar42 == true) {
      pIVar48->NavDisableMouseHover = false;
    }
  }
  DockContextNewFrameUpdateUndocking(local_68);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar30 = GetTopMostPopupModal();
  if ((pIVar30 != (ImGuiWindow *)0x0) ||
     ((pIVar46->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar46->NavWindowingHighlightAlpha)))) {
    fVar54 = (pIVar46->IO).DeltaTime * 6.0 + pIVar46->DimBgRatio;
    if (1.0 <= fVar54) {
      fVar54 = 1.0;
    }
    pIVar46->DimBgRatio = fVar54;
  }
  else {
    fVar54 = (pIVar46->IO).DeltaTime * -10.0 + pIVar46->DimBgRatio;
    pIVar46->DimBgRatio = (float)(-(uint)(0.0 <= fVar54) & (uint)fVar54);
  }
  pIVar46->MouseCursor = 0;
  pIVar46->WantTextInputNextFrame = -1;
  pIVar46->WantCaptureMouseNextFrame = -1;
  pIVar46->WantCaptureKeyboardNextFrame = -1;
  (pIVar46->PlatformImePos).x = 1.0;
  (pIVar46->PlatformImePos).y = 1.0;
  pIVar46->PlatformImePosViewport = (ImGuiViewportP *)0x0;
  pIVar48 = GImGui;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar17 = IsMousePosValid((ImVec2 *)0x0);
    if (((bVar17) &&
        (fVar54 = (pIVar48->IO).MouseDragThreshold,
        fVar55 = (pIVar48->IO).MousePos.x - (pIVar48->WheelingWindowRefMousePos).x,
        fVar69 = (pIVar48->IO).MousePos.y - (pIVar48->WheelingWindowRefMousePos).y,
        fVar54 * fVar54 < fVar55 * fVar55 + fVar69 * fVar69)) ||
       (pIVar48->WheelingWindowTimer <= 0.0)) {
      pIVar48->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar48->WheelingWindowTimer = 0.0;
    }
  }
  fVar54 = (pIVar48->IO).MouseWheel;
  if (((((fVar54 != 0.0) || (fVar55 = (pIVar48->IO).MouseWheelH, fVar55 != 0.0)) || (NAN(fVar55)))
      && ((pIVar48->ActiveId == 0 || (pIVar48->ActiveIdUsingMouseWheel == false)))) &&
     (((pIVar48->HoveredIdPreviousFrame == 0 ||
       (pIVar48->HoveredIdPreviousFrameUsingMouseWheel == false)) &&
      (((pIVar30 = pIVar48->WheelingWindow, pIVar30 != (ImGuiWindow *)0x0 ||
        (pIVar30 = pIVar48->HoveredWindow, pIVar30 != (ImGuiWindow *)0x0)) &&
       (pIVar30->Collapsed == false)))))) {
    bVar17 = (pIVar48->IO).KeyCtrl;
    if ((fVar54 != 0.0) || (NAN(fVar54))) {
      if ((bVar17 & 1U) == 0) goto LAB_0012d1e2;
      if ((pIVar48->IO).FontAllowUserScaling == true) {
        StartLockWheelingWindow(pIVar30);
        fVar54 = pIVar30->FontWindowScale;
        fVar69 = (pIVar48->IO).MouseWheel * 0.1 + fVar54;
        fVar55 = 2.5;
        if (fVar69 <= 2.5) {
          fVar55 = fVar69;
        }
        fVar55 = (float)(-(uint)(fVar69 < 0.5) & 0x3f000000 | ~-(uint)(fVar69 < 0.5) & (uint)fVar55)
        ;
        pIVar30->FontWindowScale = fVar55;
        if (pIVar30 == pIVar30->RootWindow) {
          fVar55 = fVar55 / fVar54;
          IVar57 = pIVar30->Size;
          IVar56 = (pIVar48->IO).MousePos;
          fVar54 = (pIVar30->Pos).x;
          fVar69 = (pIVar30->Pos).y;
          auVar75._0_4_ = (IVar56.x - fVar54) * (1.0 - fVar55) * IVar57.x;
          auVar75._4_4_ = (IVar56.y - fVar69) * (1.0 - fVar55) * IVar57.y;
          auVar75._8_8_ = 0;
          auVar12._8_8_ = 0;
          auVar12._0_4_ = IVar57.x;
          auVar12._4_4_ = IVar57.y;
          auVar73 = divps(auVar75,auVar12);
          local_78.Min.x = auVar73._0_4_ + fVar54;
          local_78.Min.y = auVar73._4_4_ + fVar69;
          SetWindowPos(pIVar30,&local_78.Min,0);
          IVar60.x = (float)(int)((pIVar30->Size).x * fVar55);
          IVar60.y = (float)(int)((pIVar30->Size).y * fVar55);
          IVar11.y = (float)(int)((pIVar30->SizeFull).y * fVar55);
          IVar11.x = (float)(int)((pIVar30->SizeFull).x * fVar55);
          pIVar30->Size = IVar60;
          pIVar30->SizeFull = IVar11;
        }
      }
    }
    else if ((bVar17 & 1U) == 0) {
LAB_0012d1e2:
      if (((pIVar48->IO).KeyShift != true) ||
         (local_b8 = fVar54, (pIVar48->IO).ConfigMacOSXBehaviors == true)) {
        local_b8 = (pIVar48->IO).MouseWheelH;
        if ((fVar54 != 0.0) || (NAN(fVar54))) {
          StartLockWheelingWindow(pIVar30);
          while ((uVar36 = pIVar30->Flags, (uVar36 >> 0x18 & 1) != 0 &&
                 (((uVar36 & 0x210) == 0x10 ||
                  ((fVar55 = (pIVar30->ScrollMax).y, fVar55 == 0.0 && (!NAN(fVar55)))))))) {
            pIVar30 = pIVar30->ParentWindow;
          }
          if ((uVar36 & 0x210) == 0) {
            fVar69 = ((pIVar30->InnerRect).Max.y - (pIVar30->InnerRect).Min.y) * 0.67;
            fVar70 = ImGuiWindow::CalcFontSize(pIVar30);
            fVar55 = fVar70 * 5.0;
            if (fVar69 <= fVar70 * 5.0) {
              fVar55 = fVar69;
            }
            (pIVar30->ScrollTarget).y = (pIVar30->Scroll).y - fVar54 * (float)(int)fVar55;
            (pIVar30->ScrollTargetCenterRatio).y = 0.0;
            (pIVar30->ScrollTargetEdgeSnapDist).y = 0.0;
          }
        }
      }
      if ((local_b8 != 0.0) || (NAN(local_b8))) {
        StartLockWheelingWindow(pIVar30);
        while ((uVar36 = pIVar30->Flags, (uVar36 >> 0x18 & 1) != 0 &&
               (((uVar36 & 0x210) == 0x10 ||
                ((fVar54 = (pIVar30->ScrollMax).x, fVar54 == 0.0 && (!NAN(fVar54)))))))) {
          pIVar30 = pIVar30->ParentWindow;
        }
        if ((uVar36 & 0x210) == 0) {
          fVar55 = ((pIVar30->InnerRect).Max.x - (pIVar30->InnerRect).Min.x) * 0.67;
          fVar69 = ImGuiWindow::CalcFontSize(pIVar30);
          fVar54 = fVar69 + fVar69;
          if (fVar55 <= fVar69 + fVar69) {
            fVar54 = fVar55;
          }
          (pIVar30->ScrollTarget).x = (pIVar30->Scroll).x - local_b8 * (float)(int)fVar54;
          (pIVar30->ScrollTargetCenterRatio).x = 0.0;
          (pIVar30->ScrollTargetEdgeSnapDist).x = 0.0;
        }
      }
    }
  }
  pIVar48 = GImGui;
  GImGui->TabFocusPressed = false;
  pIVar30 = pIVar48->NavWindow;
  if ((((((pIVar30 != (ImGuiWindow *)0x0) && (pIVar30->Active == true)) &&
        ((pIVar30->Flags & 0x40000) == 0)) &&
       (((pIVar48->IO).KeyCtrl == false && ((pIVar48->IO).KeyAlt == false)))) &&
      (bVar17 = IsKeyPressedMap(0,true), bVar17)) && ((GImGui->ActiveIdUsingKeyInputMask & 1) == 0))
  {
    pIVar48->TabFocusPressed = true;
  }
  if ((pIVar48->ActiveId == 0) && (pIVar48->TabFocusPressed == true)) {
    pIVar48->TabFocusRequestNextWindow = pIVar48->NavWindow;
    if ((pIVar48->NavId == 0) || (iVar41 = pIVar48->NavIdTabCounter, iVar41 == 0x7fffffff)) {
      iVar41 = 0;
    }
    pIVar48->TabFocusRequestNextCounterTabStop = iVar41 - (uint)(pIVar48->IO).KeyShift;
  }
  pIVar48->TabFocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar48->TabFocusRequestCurrCounterTabStop = 0x7fffffff;
  pIVar30 = pIVar48->TabFocusRequestNextWindow;
  if (pIVar30 != (ImGuiWindow *)0x0) {
    pIVar48->TabFocusRequestCurrWindow = pIVar30;
    if ((pIVar48->TabFocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar41 = (pIVar30->DC).FocusCounterTabStop, iVar41 != -1)) {
      pIVar48->TabFocusRequestCurrCounterTabStop =
           (pIVar48->TabFocusRequestNextCounterTabStop + iVar41 + 1) % (iVar41 + 1);
    }
    pIVar48->TabFocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar48->TabFocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar48->NavIdTabCounter = 0x7fffffff;
  iVar41 = (pIVar46->Windows).Size;
  if (iVar41 < (pIVar46->WindowsFocusOrder).Size) {
    __assert_fail("g.WindowsFocusOrder.Size <= g.Windows.Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x10ab,"void ImGui::NewFrame()");
  }
  local_b8 = 3.4028235e+38;
  if ((pIVar46->GcCompactAll == false) &&
     (fVar54 = (pIVar46->IO).ConfigMemoryCompactTimer, 0.0 <= fVar54)) {
    local_b8 = (float)pIVar46->Time - fVar54;
  }
  for (iVar50 = 0; iVar50 != iVar41; iVar50 = iVar50 + 1) {
    ppIVar29 = ImVector<ImGuiWindow_*>::operator[](&pIVar46->Windows,iVar50);
    pIVar30 = *ppIVar29;
    bVar17 = pIVar30->Active;
    pIVar30->WasActive = bVar17;
    pIVar30->BeginCount = 0;
    pIVar30->Active = false;
    pIVar30->WriteAccessed = false;
    if (((bVar17 == false) && (pIVar30->MemoryCompacted == false)) &&
       (pIVar30->LastTimeActive <= local_b8 && local_b8 != pIVar30->LastTimeActive)) {
      GcCompactTransientWindowBuffers(pIVar30);
    }
    iVar41 = (pIVar46->Windows).Size;
  }
  this_01 = &pIVar46->TablesLastTimeActive;
  for (iVar41 = 0; iVar41 < this_01->Size; iVar41 = iVar41 + 1) {
    pfVar31 = ImVector<float>::operator[](this_01,iVar41);
    if ((0.0 <= *pfVar31) &&
       (pfVar31 = ImVector<float>::operator[](this_01,iVar41),
       *pfVar31 <= local_b8 && local_b8 != *pfVar31)) {
      table = ImVector<ImGuiTable>::operator[](&(pIVar46->Tables).Buf,iVar41);
      TableGcCompactTransientBuffers(table);
    }
  }
  this_02 = &pIVar46->TablesTempData;
  for (iVar41 = 0; iVar41 < this_02->Size; iVar41 = iVar41 + 1) {
    pIVar32 = ImVector<ImGuiTableTempData>::operator[](this_02,iVar41);
    if ((0.0 <= pIVar32->LastTimeActive) &&
       (pIVar32 = ImVector<ImGuiTableTempData>::operator[](this_02,iVar41),
       pIVar32->LastTimeActive <= local_b8 && local_b8 != pIVar32->LastTimeActive)) {
      pIVar32 = ImVector<ImGuiTableTempData>::operator[](this_02,iVar41);
      TableGcCompactTransientBuffers(pIVar32);
    }
  }
  if (pIVar46->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  pIVar46->GcCompactAll = false;
  if ((pIVar46->NavWindow != (ImGuiWindow *)0x0) && (pIVar46->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  ImVector<ImGuiWindowStackData>::resize(&pIVar46->CurrentWindowStack,0);
  ImVector<ImGuiPopupData>::resize(&pIVar46->BeginPopupStack,0);
  ImVector<int>::resize(&pIVar46->ItemFlagsStack,0);
  local_78.Min = (ImVec2)((ulong)local_78.Min & 0xffffffff00000000);
  ImVector<int>::push_back(&pIVar46->ItemFlagsStack,(int *)&local_78);
  ImVector<ImGuiGroupData>::resize(&pIVar46->GroupStack,0);
  DockContextNewFrameUpdateDocking(pIVar46);
  pIVar48 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar48->DebugItemPickerActive == true) {
    uVar36 = pIVar48->HoveredIdPreviousFrame;
    pIVar48->MouseCursor = 7;
    bVar17 = IsKeyPressedMap(0xe,true);
    if (bVar17) {
      pIVar48->DebugItemPickerActive = false;
    }
    pIVar16 = GImGui;
    fVar54 = (GImGui->IO).MouseDownDuration[0];
    if ((fVar54 != 0.0) || (NAN(fVar54))) {
      uVar51 = (uint)(uVar36 == 0);
    }
    else if (uVar36 == 0) {
      uVar51 = 1;
    }
    else {
      pIVar48->DebugItemPickerBreakId = uVar36;
      pIVar48->DebugItemPickerActive = false;
      uVar51 = 0;
    }
    pIVar2 = &pIVar16->NextWindowData;
    *(byte *)&pIVar2->Flags = (byte)pIVar2->Flags | 0x40;
    (pIVar16->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltip();
    Text("HoveredId: 0x%08X",(ulong)uVar36);
    Text("Press ESC to abort picking.");
    TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar51 << 4)),
                "Click to break in debugger!");
    EndTooltip();
    pIVar48 = GImGui;
  }
  pIVar48->DebugHookIdInfo = 0;
  if (pIVar48->FrameCount != (pIVar48->DebugStackTool).LastActiveFrame + 1) goto LAB_0012d30d;
  IVar37 = pIVar48->ActiveId;
  if (IVar37 == 0) {
    IVar37 = pIVar48->HoveredIdPreviousFrame;
  }
  if ((pIVar48->DebugStackTool).QueryId != IVar37) {
    (pIVar48->DebugStackTool).QueryId = IVar37;
    (pIVar48->DebugStackTool).StackLevel = -1;
    ImVector<ImGuiStackLevelInfo>::resize(&(pIVar48->DebugStackTool).Results,0);
  }
  if (IVar37 == 0) goto LAB_0012d30d;
  iVar41 = (pIVar48->DebugStackTool).StackLevel;
  if (iVar41 < 0) {
LAB_0012d2c9:
    if (iVar41 == -1) {
      pIVar48->DebugHookIdInfo = IVar37;
      goto LAB_0012d30d;
    }
    if (iVar41 < 0) goto LAB_0012d30d;
    iVar50 = (pIVar48->DebugStackTool).Results.Size;
  }
  else {
    iVar50 = (pIVar48->DebugStackTool).Results.Size;
    if (iVar41 < iVar50) {
      pIVar3 = &(pIVar48->DebugStackTool).Results;
      pIVar33 = ImVector<ImGuiStackLevelInfo>::operator[](pIVar3,iVar41);
      if ((pIVar33->QuerySuccess == false) &&
         (pIVar33 = ImVector<ImGuiStackLevelInfo>::operator[](pIVar3,iVar41),
         pIVar33->QueryFrameCount < '\x03')) {
        iVar41 = (pIVar48->DebugStackTool).StackLevel;
      }
      else {
        iVar41 = (pIVar48->DebugStackTool).StackLevel + 1;
        (pIVar48->DebugStackTool).StackLevel = iVar41;
      }
      goto LAB_0012d2c9;
    }
  }
  if (iVar41 < iVar50) {
    pIVar3 = &(pIVar48->DebugStackTool).Results;
    pIVar33 = ImVector<ImGuiStackLevelInfo>::operator[](pIVar3,iVar41);
    pIVar48->DebugHookIdInfo = pIVar33->ID;
    pIVar33 = ImVector<ImGuiStackLevelInfo>::operator[](pIVar3,iVar41);
    pIVar33->QueryFrameCount = pIVar33->QueryFrameCount + '\x01';
  }
LAB_0012d30d:
  pIVar46->WithinFrameScopeWithImplicitWindow = true;
  pIVar48 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar48->NextWindowData).SizeVal.x = 400.0;
  (pIVar48->NextWindowData).SizeVal.y = 400.0;
  (pIVar48->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (pIVar46->CurrentWindow->IsFallbackWindow != false) {
    CallContextHooks(pIVar46,ImGuiContextHookType_NewFramePost);
    return;
  }
  __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0x10de,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    g.ConfigFlagsLastFrame = g.ConfigFlagsCurrFrame;
    ErrorCheckNewFrameSanityChecks();
    g.ConfigFlagsCurrFrame = g.IO.ConfigFlags;

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    // FIXME-VIEWPORT: the concept of a single ClipRectFullscreen is not ideal!
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawData = NULL;
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Clear buttons state when focus is lost
    // (this is useful so e.g. releasing Alt after focus loss on Alt-Tab doesn't trigger the Alt menu toggle)
    if (g.IO.AppFocusLost)
    {
        g.IO.ClearInputKeys();
        g.IO.AppFocusLost = false;
    }

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Undocking
    // (needs to be before UpdateMouseMovingWindowNewFrame so the window is already offset and following the mouse on the detaching frame)
    DockContextNewFrameUpdateUndocking(&g);

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default
    g.PlatformImePosViewport = NULL;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // Docking
    DockContextNewFrameUpdateDocking(&g);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}